

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZStructMatrix::SetMaterialIds
          (TPZStructMatrix *this,set<int,_std::less<int>,_std::allocator<int>_> *materialids)

{
  TPZCompMesh *pTVar1;
  TPZStructMatrix *this_00;
  TPZCompEl **ppTVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long nelem;
  TPZAutoPointer<TPZLinearAnalysis> analysis;
  TPZSavable local_38;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&(this->fMaterialIds)._M_t,&materialids->_M_t);
  pTVar1 = this->fMesh;
  if (pTVar1 == (TPZCompMesh *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SetMaterialIds called without mesh");
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  lVar5 = (pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  nelem = 0;
  if (lVar5 < 1) {
    lVar5 = nelem;
  }
  do {
    if (lVar5 == nelem) {
      return;
    }
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    if (*ppTVar2 != (TPZCompEl *)0x0) {
      lVar3 = __dynamic_cast(*ppTVar2,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
      if (lVar3 != 0) {
        analysis.fRef = *(TPZReference **)(lVar3 + 0x940);
        LOCK();
        ((analysis.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((analysis.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if ((analysis.fRef == (TPZReference *)0x0) ||
           ((analysis.fRef)->fPointer == (TPZLinearAnalysis *)0x0)) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "SetMaterialIds called for substructure without analysis object")
          ;
          std::endl<char,std::char_traits<char>>(poVar4);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZStructMatrix.cpp"
                     ,0x5c);
        }
        TPZAnalysis::StructMatrix((TPZAnalysis *)&stack0xffffffffffffffc8);
        this_00 = (TPZStructMatrix *)*local_38._vptr_TPZSavable;
        TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZStructMatrix> *)&stack0xffffffffffffffc8);
        if (this_00 == (TPZStructMatrix *)0x0) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "SetMaterialIds called for substructure without structural matrix"
                                  );
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        else {
          SetMaterialIds(this_00,materialids);
        }
        TPZAutoPointer<TPZLinearAnalysis>::~TPZAutoPointer(&analysis);
      }
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

void TPZStructMatrix::SetMaterialIds(const std::set<int> &materialids)
{
    fMaterialIds = materialids;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::set<int>::const_iterator it;
        std::stringstream sout;
        sout << "setting input material ids ";
        for(it=materialids.begin(); it!= materialids.end(); it++)
        {
            sout << *it << " ";
        }
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    if(!fMesh)
    {
        LOGPZ_ERROR(logger,"SetMaterialIds called without mesh")
        return;
    }
    int64_t iel;
    TPZAdmChunkVector<TPZCompEl*> &elvec = fMesh->ElementVec();
    int64_t nel = elvec.NElements();
    for(iel=0; iel<nel; iel++)
    {
        TPZCompEl *cel = elvec[iel];
        if(!cel) continue;
        TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *> (cel);
        if(!subcmesh) continue;
        TPZAutoPointer<TPZLinearAnalysis> analysis = subcmesh->Analysis();
        if(!analysis)
        {
            LOGPZ_ERROR(logger,"SetMaterialIds called for substructure without analysis object")
            DebugStop();
        }
        TPZStructMatrix *str = analysis->StructMatrix().operator->();
        if(!str)
        {
            LOGPZ_ERROR(logger,"SetMaterialIds called for substructure without structural matrix")
            continue;
        }
        str->SetMaterialIds(materialids);
    }
}